

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sleigh.cc
# Opt level: O2

void __thiscall SleighBuilder::delaySlot(SleighBuilder *this,OpTpl *op)

{
  int iVar1;
  int iVar2;
  ParserContext *pPVar3;
  LowlevelError *this_00;
  int iVar4;
  allocator local_101;
  uintb local_100;
  ParserWalker *local_f8;
  Address newaddr;
  Address baseaddr;
  ParserWalker newwalker;
  
  local_f8 = (this->super_PcodeBuilder).walker;
  local_100 = this->uniqueoffset;
  pPVar3 = local_f8->cross_context;
  if (local_f8->cross_context == (ParserContext *)0x0) {
    pPVar3 = local_f8->const_context;
  }
  baseaddr.base = (pPVar3->addr).base;
  baseaddr.offset = (pPVar3->addr).offset;
  iVar1 = local_f8->const_context->delayslot;
  iVar4 = 0;
  do {
    Address::operator+(&newaddr,(int4)&baseaddr);
    this->uniqueoffset = (this->uniquemask & newaddr.offset) << 4;
    pPVar3 = DisassemblyCache::getParserContext(this->discache,&newaddr);
    if (pPVar3->parsestate != 2) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::__cxx11::string::string
                ((string *)&newwalker,"Could not obtain cached delay slot instruction",&local_101);
      LowlevelError::LowlevelError(this_00,(string *)&newwalker);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
    newwalker.point = pPVar3->base_state;
    iVar2 = (newwalker.point)->length;
    newwalker.cross_context = (ParserContext *)0x0;
    (this->super_PcodeBuilder).walker = &newwalker;
    newwalker.depth = 0;
    newwalker.breadcrumb[0] = 0;
    newwalker.const_context = pPVar3;
    PcodeBuilder::build(&this->super_PcodeBuilder,(newwalker.point)->ct->templ,-1);
    iVar4 = iVar4 + iVar2;
  } while (iVar4 < iVar1);
  (this->super_PcodeBuilder).walker = local_f8;
  this->uniqueoffset = local_100;
  return;
}

Assistant:

void SleighBuilder::delaySlot(OpTpl *op)

{				// Append pcode for an entire instruction (delay slot)
				// in the middle of the current instruction
  ParserWalker *tmp = walker;
  uintb olduniqueoffset = uniqueoffset;

  Address baseaddr = tmp->getAddr();
  int4 fallOffset = tmp->getLength();
  int4 delaySlotByteCnt = tmp->getParserContext()->getDelaySlot();
  int4 bytecount = 0;
  do {
    Address newaddr = baseaddr + fallOffset;
    setUniqueOffset(newaddr);
    const ParserContext *pos = discache->getParserContext(newaddr);
    if (pos->getParserState() != ParserContext::pcode)
      throw LowlevelError("Could not obtain cached delay slot instruction");
    int4 len = pos->getLength();

    ParserWalker newwalker( pos );
    walker = &newwalker;
    walker->baseState();
    build(walker->getConstructor()->getTempl(),-1); // Build the whole delay slot
    fallOffset += len;
    bytecount += len;
  } while(bytecount < delaySlotByteCnt);
  walker = tmp;			// Restore original context
  uniqueoffset = olduniqueoffset;
}